

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharTrie.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::RuntimeCharTrie::FreeBody(RuntimeCharTrie *this,ArenaAllocator *allocator)

{
  int local_1c;
  int i;
  ArenaAllocator *allocator_local;
  RuntimeCharTrie *this_local;
  
  for (local_1c = 0; local_1c < this->count; local_1c = local_1c + 1) {
    FreeBody(&this->children[local_1c].node,allocator);
  }
  if (0 < this->count) {
    Memory::DeleteArray<Memory::ArenaAllocator,UnifiedRegex::RuntimeCharTrieEntry>
              (allocator,(long)this->count,this->children);
  }
  this->count = 0;
  this->children = (RuntimeCharTrieEntry *)0x0;
  return;
}

Assistant:

void RuntimeCharTrie::FreeBody(ArenaAllocator* allocator)
    {
        for (int i = 0; i < count; i++)
            children[i].node.FreeBody(allocator);
        if (count > 0)
            AdeleteArray(allocator, count, children);
#if DBG
        count = 0;
        children = 0;
#endif
    }